

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Process.cpp
# Opt level: O3

int __thiscall Process::open(Process *this,char *__file,int __oflag,...)

{
  String *pSVar1;
  int iVar2;
  char *pcVar3;
  uint in_ECX;
  usize uVar4;
  String *this_00;
  Array<const_char_*> argv;
  Array<const_char_*> local_108;
  char *local_f0;
  Map<String,_String> local_e8;
  
  uVar4 = ___oflag[2];
  local_108._begin.item = (char **)0x0;
  local_108._end.item = (char **)0x0;
  pSVar1 = (String *)*___oflag;
  this_00 = (String *)___oflag[1];
  local_108._capacity = uVar4;
  if (this_00 != pSVar1) {
    local_f0 = __file;
    do {
      pcVar3 = String::operator_cast_to_char_(this_00);
      Array<const_char_*>::reserve
                (&local_108,((long)local_108._end.item - (long)local_108._begin.item >> 3) + 1);
      *local_108._end.item = pcVar3;
      local_108._end.item = local_108._end.item + 1;
      this_00 = (String *)this_00[1]._data.str;
    } while (this_00 != pSVar1);
    uVar4 = ___oflag[2];
    __file = local_f0;
  }
  local_e8._end.item = &local_e8.endItem;
  local_e8.root = (Item *)0x0;
  local_e8._size = 0;
  local_e8.endItem.key.data = &String::emptyData.super_Data;
  local_e8.endItem.value.data = &String::emptyData.super_Data;
  local_e8.endItem.parent = (Item *)0x0;
  local_e8.endItem.next = (Item *)0x0;
  local_e8.endItem.prev = (Item *)0x0;
  local_e8.freeItem = (Item *)0x0;
  local_e8.blocks = (ItemBlock *)0x0;
  local_e8._begin.item = local_e8._end.item;
  iVar2 = open(this,__file,(int)uVar4,local_108._begin.item,(ulong)in_ECX,&local_e8);
  Map<String,_String>::~Map(&local_e8);
  if (local_108._begin.item != (char **)0x0) {
    operator_delete__(local_108._begin.item);
  }
  return iVar2;
}

Assistant:

bool Process::open(const String& executable, const List<String>& args, uint streams, const Map<String, String>& environment)
{
  Array<const char*> argv(args.size());
  for (List<String>::Iterator i = args.begin(), end = args.end(); i != end; ++i)
    argv.append((const char*)*i);
  return open(executable, (int)args.size(), (char**)(const char**)argv, streams);
}